

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBruteForceSearch.h
# Opt level: O0

double __thiscall
BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve
          (BGIP_SolverBruteForceSearch<JointPolicyPureVector> *this)

{
  timeval tVar1;
  timeval tVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  LIndex LVar8;
  undefined8 uVar9;
  element_type *peVar10;
  type pJVar11;
  type this_00;
  ostream *poVar12;
  ofstream *poVar13;
  BayesianGameIdenticalPayoffSolver *in_RDI;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double delta;
  Index ja;
  double P_jt;
  Index jt;
  BayesianGameIdenticalPayoffInterface *bgipRawPtr;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> bgip;
  JointPolicyPureVector *jpolRawPtr;
  EDeadline e;
  stringstream ss;
  double expectedTimeNeeded;
  LIndex nrJPols;
  double timeSpentInS;
  clock_t utime;
  size_t nrDesiredSolutions;
  size_t nrJT;
  int i;
  double v;
  double v_best;
  shared_ptr<JointPolicyPureVector> best;
  shared_ptr<JointPolicyPureVector> jpol;
  bool round;
  LIndex checkPointForDeadline;
  tms ts_after;
  tms ts_before;
  timeval cur_time;
  timeval start_time;
  EDeadline *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  shared_ptr<JointPolicyDiscretePure> *in_stack_fffffffffffffb98;
  double in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  uint local_334;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_328;
  element_type *local_318;
  string local_310 [80];
  stringstream local_2c0 [16];
  ostream local_2b0 [376];
  double local_138;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_130;
  LIndex local_120;
  double local_118;
  long local_110;
  size_t local_108;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_100;
  ulong local_f0;
  int local_e4;
  double local_e0;
  double local_d8;
  undefined1 local_c0 [16];
  shared_ptr<JointPolicyPureVector> local_b0 [2];
  shared_ptr<JointPolicyPureVector> local_90;
  byte local_79;
  ulong local_78;
  tms local_70;
  tms local_50;
  __time_t local_30;
  __suseconds_t _Stack_28;
  timeval local_20;
  double local_8;
  
  in_RDI[0x120] = (BayesianGameIdenticalPayoffSolver)0x1;
  iVar4 = gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  if (iVar4 != 0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "Error with gettimeofday";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  times(&local_50);
  local_78 = 1000000;
  local_79 = 0;
  (**(code **)(*(long *)in_RDI + 0x38))();
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            (in_stack_fffffffffffffb98);
  boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x126977);
  (**(code **)(*(long *)in_RDI + 0x38))(local_c0);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            (in_stack_fffffffffffffb98);
  boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x1269bc);
  local_d8 = -1.79769313486232e+308;
  local_e0 = 0.0;
  local_e4 = 0;
  BayesianGameIdenticalPayoffSolver::GetBGIPI
            ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffb78);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_100);
  uVar6 = BayesianGameBase::GetNrJointTypes();
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x126a2e);
  local_f0 = uVar6;
  local_108 = BayesianGameIdenticalPayoffSolver::GetNrDesiredSolutions
                        ((BayesianGameIdenticalPayoffSolver *)0x126a4b);
  do {
    if (((local_79 ^ 0xff) & 1) == 0) {
      bVar3 = BayesianGameIdenticalPayoffSolver::GetWriteAnyTimeResults(in_RDI);
      if (bVar3) {
        poVar13 = BayesianGameIdenticalPayoffSolver::GetResultsOFStream(in_RDI);
        std::ostream::operator<<((ostream *)poVar13,std::endl<char,std::char_traits<char>>);
        poVar13 = BayesianGameIdenticalPayoffSolver::GetTimingsOFStream(in_RDI);
        std::ostream::operator<<((ostream *)poVar13,std::endl<char,std::char_traits<char>>);
      }
      if (local_108 == 1) {
        boost::shared_ptr<JointPolicyPureVector>::operator*(local_b0);
        BayesianGameIdenticalPayoffSolver::AddSolution
                  ((BayesianGameIdenticalPayoffSolver *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                   (JointPolicyPureVector *)in_stack_fffffffffffffb78,5.97412815441381e-318);
      }
      local_8 = local_d8;
      break;
    }
    if ((*(long *)(in_RDI + 0x118) != 0) && ((ulong)(long)local_e4 % local_78 == 0)) {
      times(&local_70);
      local_110 = local_70.tms_utime - local_50.tms_utime;
      dVar14 = (double)local_110;
      lVar7 = sysconf(2);
      local_118 = dVar14 / (double)lVar7;
      if (2.0 <= local_118) {
        BayesianGameIdenticalPayoffSolver::GetBGIPI
                  ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffb78);
        boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_130);
        LVar8 = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)0x126bbd);
        boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                  ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x126bd4);
        local_120 = LVar8;
        dVar14 = (double)Globals::CastLIndexToDouble(LVar8);
        dVar15 = (double)Globals::CastLIndexToDouble(local_78);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar15;
        local_138 = (dVar14 / dVar15) * local_118;
        auVar17 = vcvtusi2sd_avx512f(auVar17,*(undefined8 *)(in_RDI + 0x118));
        if (auVar17._0_8_ * 1.5 < local_138) {
          std::__cxx11::stringstream::stringstream(local_2c0);
          poVar12 = std::operator<<(local_2b0,"BGIP_SolverBruteForceSearch::Solve after ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_78);
          poVar12 = std::operator<<(poVar12," we spent ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_118);
          poVar12 = std::operator<<(poVar12,"s, for all ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_120);
          poVar12 = std::operator<<(poVar12," jpols we expect to take ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_138);
          poVar12 = std::operator<<(poVar12,"s, which is above the deadline (>1.5*");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*(ulong *)(in_RDI + 0x118));
          std::operator<<(poVar12,"s), bailing out");
          std::__cxx11::stringstream::str();
          EDeadline::EDeadline
                    ((EDeadline *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
          std::__cxx11::string::~string(local_310);
          uVar9 = __cxa_allocate_exception(0x30);
          EDeadline::EDeadline
                    ((EDeadline *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78);
          __cxa_throw(uVar9,&EDeadline::typeinfo,EDeadline::~EDeadline);
        }
      }
      else {
        local_78 = local_78 << 1;
      }
    }
    local_e4 = local_e4 + 1;
    local_e0 = 0.0;
    local_318 = boost::shared_ptr<JointPolicyPureVector>::get(&local_90);
    BayesianGameIdenticalPayoffSolver::GetBGIPI
              ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffb78);
    peVar10 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::get(&local_328);
    for (local_334 = 0; local_334 < local_f0; local_334 = local_334 + 1) {
      in_stack_fffffffffffffbb0 = (double)(**(code **)(*(long *)peVar10 + 0x68))(peVar10,local_334);
      in_stack_fffffffffffffbc4 = (**(code **)(*(long *)local_318 + 0x88))(local_318,local_334);
      auVar16._0_8_ =
           (string *)
           (**(code **)(*(long *)peVar10 + 0x80))(peVar10,local_334,in_stack_fffffffffffffbc4);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = in_stack_fffffffffffffbb0;
      auVar16._8_8_ = 0;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_e0;
      auVar17 = vfmadd213sd_fma(auVar16,auVar18,auVar19);
      local_e0 = auVar17._0_8_;
      in_stack_fffffffffffffbb8 = auVar16._0_8_;
    }
    if (local_d8 < local_e0) {
      local_d8 = local_e0;
      pJVar11 = boost::shared_ptr<JointPolicyPureVector>::operator*(&local_90);
      this_00 = boost::shared_ptr<JointPolicyPureVector>::operator*(local_b0);
      JointPolicyPureVector::operator=(this_00,(JointPolicyPureVector *)pJVar11);
      bVar3 = BayesianGameIdenticalPayoffSolver::GetWriteAnyTimeResults(in_RDI);
      if (bVar3) {
        tVar2.tv_usec = local_20.tv_usec;
        tVar2.tv_sec = local_20.tv_sec;
        tVar1.tv_usec = _Stack_28;
        tVar1.tv_sec = local_30;
        dVar14 = (double)TimeTools::GetDeltaTimeDouble(tVar2,tVar1);
        poVar13 = BayesianGameIdenticalPayoffSolver::GetResultsOFStream(in_RDI);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar13,local_d8);
        std::operator<<(poVar12,"\t");
        poVar13 = BayesianGameIdenticalPayoffSolver::GetTimingsOFStream(in_RDI);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar13,dVar14);
        std::operator<<(poVar12,"\t");
      }
    }
    if ((local_108 != 1) || (local_e0 < *(double *)(in_RDI + 0x130) - 1e-12)) {
      if (1 < local_108) {
        boost::shared_ptr<JointPolicyPureVector>::operator*(&local_90);
        BayesianGameIdenticalPayoffSolver::AddSolution
                  ((BayesianGameIdenticalPayoffSolver *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                   (JointPolicyPureVector *)in_stack_fffffffffffffb78,5.97304120999296e-318);
      }
      boost::shared_ptr<JointPolicyPureVector>::operator*(&local_90);
      in_stack_fffffffffffffb87 =
           JointPolicyPureVector::operator++((JointPolicyPureVector *)0x127296);
      bVar3 = false;
      local_79 = in_stack_fffffffffffffb87;
    }
    else {
      poVar12 = std::operator<<((ostream *)&std::cout,"Hit CBG upperbound");
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      boost::shared_ptr<JointPolicyPureVector>::operator*(&local_90);
      BayesianGameIdenticalPayoffSolver::AddSolution
                ((BayesianGameIdenticalPayoffSolver *)
                 CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 (JointPolicyPureVector *)in_stack_fffffffffffffb78,5.97263607616337e-318);
      local_8 = local_e0;
      bVar3 = true;
    }
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x1272c1);
  } while (!bVar3);
  boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
            ((shared_ptr<JointPolicyPureVector> *)0x127387);
  boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
            ((shared_ptr<JointPolicyPureVector> *)0x127394);
  return local_8;
}

Assistant:

double Solve()
    {    
        _m_solved = true;
        struct timeval start_time, cur_time;
        if(gettimeofday(&start_time, NULL) != 0)
            throw "Error with gettimeofday";

        tms ts_before, ts_after;
        times(&ts_before);
        LIndex checkPointForDeadline = 1000000;

        bool round = false;

        boost::shared_ptr<JP> jpol = 
            boost::dynamic_pointer_cast<JP>(this->GetNewJpol());
        boost::shared_ptr<JP> best = 
            boost::dynamic_pointer_cast<JP>(this->GetNewJpol());

        double v_best = -DBL_MAX;
        double v = 0.0;

        int i = 0;
        if(DEBUG_BGIP_SOLVER_BFS)
            std::cout<<"Starting Bruteforce search - v_best is init to "<<v_best<<std::endl;
#if DEBUG_BGIP_SOLVER_BFS_PRINTOUTPROGRESS
        LIndex nrJPols = this->GetBGIPI()->GetNrJointPolicies();
#endif

        size_t nrJT = this->GetBGIPI()->
            GetNrJointTypes();
        size_t nrDesiredSolutions = this->GetNrDesiredSolutions();
        
        while(!round)
        {
            if(DEBUG_BGIP_SOLVER_BFS){std::cout << "Jpol#"<< i << " - ";}
#if DEBUG_BGIP_SOLVER_BFS_PRINTOUTPROGRESS
            if(i % 1000 == 0&& i > 1000)
            {
                std::cout << "Jpol #"<< i << " of " << nrJPols<< " - ";
                printf("%.4f", ((double)i / nrJPols) * 100 );
                std::cout << "%" << std::endl;
            }
#endif
            //this checks whether BFS has used more time then allowed 
            //(the deadline) and throws an exception if it has.
            if(_m_deadlineInSeconds && (i % checkPointForDeadline) == 0)
            {
                times(&ts_after);
                clock_t utime = ts_after.tms_utime -
                    ts_before.tms_utime;
                double timeSpentInS = static_cast<double>(utime) / sysconf(_SC_CLK_TCK);

                // we don't want to base our estimate on too few
                // time, so make it run at least 2s
                if(timeSpentInS < 2)
                    checkPointForDeadline *= 2;
                else
                {
                    LIndex nrJPols = this->
                        GetBGIPI()->GetNrJointPolicies();
                    double expectedTimeNeeded=
                        (CastLIndexToDouble(nrJPols)/
                         CastLIndexToDouble(checkPointForDeadline))*
                        timeSpentInS;
                    if(expectedTimeNeeded > (1.5*_m_deadlineInSeconds))
                    {
                        std::stringstream ss;
                        ss << "BGIP_SolverBruteForceSearch::Solve after " 
                           << checkPointForDeadline
                           << " we spent " << timeSpentInS << "s, for all " << nrJPols
                           << " jpols we expect to take " << expectedTimeNeeded
                           << "s, which is above the deadline (>1.5*" 
                           << _m_deadlineInSeconds << "s), bailing out";
                        EDeadline e(ss.str(),expectedTimeNeeded);
                        throw(e);
                    }
                }
            }
            ++i;
            
            v = 0.0;

            JP *jpolRawPtr = jpol.get();
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> 
                bgip= this->GetBGIPI();
            const BayesianGameIdenticalPayoffInterface *bgipRawPtr=
                bgip.get();
            for(Index jt = 0; jt < nrJT; ++jt)
            {
                double P_jt = bgipRawPtr->GetProbability(jt);
                Index ja = jpolRawPtr->GetJointActionIndex(jt);  
                v += P_jt * bgipRawPtr->GetUtility(jt, ja);
            }

            if(DEBUG_BGIP_SOLVER_BFS) std::cout << "Expected value = "<< v;
            if(v > v_best)
            {
                if(DEBUG_BGIP_SOLVER_BFS) std::cout << " -> new best policy!!!";
                v_best = v;
                *best = *jpol; 
                if(this->GetWriteAnyTimeResults()){
                    double delta  = TimeTools::GetDeltaTimeDouble(start_time, cur_time);
                    (*this->GetResultsOFStream()) << v_best << "\t";
                    (*this->GetTimingsOFStream()) << delta << "\t";
                }
            }

            if(nrDesiredSolutions == 1 &&
               (v >= (_m_CBGupperBound-PROB_PRECISION)))
            {
                std::cout << "Hit CBG upperbound" << std::endl;
                this->AddSolution( *jpol, v );
                return(v);
                break;
            }

            // if we want more than just the single best solution, try to add all to the solution
            if(nrDesiredSolutions>1)
            {
                this->AddSolution( *jpol, v );
//                      std::cout << "added solution with value " << v << ", best is "
//                                << this->GetPayoff() << std::endl;
//                      std::cout << this->GetSolution().SoftPrint();
            }
            if(DEBUG_BGIP_SOLVER_BFS) {    
                std::cout <<  std::endl << "Incrementing joint policy..."<<std::endl; 
            }    
            round = ++(*jpol);
        }
        //end the line in the results file
        if(this->GetWriteAnyTimeResults()){
            (*this->GetResultsOFStream()) << std::endl;
            (*this->GetTimingsOFStream()) << std::endl;
        } 

        // if _m_nrSolutions>1 then we already added this to the queue
        if(nrDesiredSolutions == 1)
            this->AddSolution( *best, v_best );

        return(v_best);
    }